

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall
json11::Value<(json11::Json::Type)4,_std::vector<json11::Json,_std::allocator<json11::Json>_>_>::
dump(Value<(json11::Json::Type)4,_std::vector<json11::Json,_std::allocator<json11::Json>_>_> *this,
    string *out)

{
  string *out_local;
  Value<(json11::Json::Type)4,_std::vector<json11::Json,_std::allocator<json11::Json>_>_>
  *this_local;
  
  json11::dump(&this->m_value,out);
  return;
}

Assistant:

void dump(string &out) const override { json11::dump(m_value, out); }